

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

void deqp::gles31::Functional::FboTestUtil::clearColorBuffer
               (Context *ctx,TextureFormat *format,Vec4 *value)

{
  TextureFormat *pTVar1;
  float *pfVar2;
  uint *puVar3;
  int *piVar4;
  Vector<float,_4> local_44;
  Vector<float,_4> local_34;
  TextureChannelClass local_24;
  Vec4 *pVStack_20;
  TextureChannelClass fmtClass;
  Vec4 *value_local;
  TextureFormat *format_local;
  Context *ctx_local;
  
  pVStack_20 = value;
  value_local = (Vec4 *)format;
  format_local = (TextureFormat *)ctx;
  local_24 = tcu::getTextureChannelClass(format->type);
  pTVar1 = format_local;
  switch(local_24) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    pfVar2 = tcu::Vector<float,_4>::getPtr(pVStack_20);
    (**(code **)((long)*pTVar1 + 0x178))(pTVar1,0x1800,0,pfVar2);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    tcu::Vector<float,_4>::asInt(&local_44);
    piVar4 = tcu::Vector<int,_4>::getPtr((Vector<int,_4> *)&local_44);
    (**(code **)((long)*pTVar1 + 0x170))(pTVar1,0x1800,0,piVar4);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    tcu::Vector<float,_4>::asUint(&local_34);
    puVar3 = tcu::Vector<unsigned_int,_4>::getPtr((Vector<unsigned_int,_4> *)&local_34);
    (**(code **)((long)*pTVar1 + 0x180))(pTVar1,0x1800,0,puVar3);
  }
  return;
}

Assistant:

void clearColorBuffer (sglr::Context& ctx, const tcu::TextureFormat& format, const tcu::Vec4& value)
{
	const tcu::TextureChannelClass fmtClass = tcu::getTextureChannelClass(format.type);

	switch (fmtClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			ctx.clearBufferfv(GL_COLOR, 0, value.getPtr());
			break;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			ctx.clearBufferuiv(GL_COLOR, 0, value.asUint().getPtr());
			break;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			ctx.clearBufferiv(GL_COLOR, 0, value.asInt().getPtr());
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}